

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

void __thiscall
leveldb::anon_unknown_1::PosixWritableFile::~PosixWritableFile(PosixWritableFile *this)

{
  ~PosixWritableFile(this);
  operator_delete(this);
  return;
}

Assistant:

~PosixWritableFile() override {
    if (fd_ >= 0) {
      // Ignoring any potential errors
      Close();
    }
  }